

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>>
               (void)

{
  Column_settings **ppCVar1;
  undefined8 uVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  reference witness;
  Returned_column *col;
  column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>_>_>
  local_398;
  reference local_368;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *b;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  uint i;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_338;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_330;
  const_iterator local_328;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_320;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_318;
  __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_310;
  const_iterator local_308;
  logic_error *ex_1;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_280;
  assertion_result local_260;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218 [8];
  logic_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]> local_188;
  assertion_result local_168;
  basic_cstring<const_char> local_150;
  basic_cstring<const_char> local_140;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120 [2];
  undefined1 local_100 [8];
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>
              *)local_100,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,
             (Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
              *)local_100);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
  ::remove_column((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
                   *)local_100,2);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
  ::remove_column((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
                   *)local_100,4);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_120,0x341,&local_130);
    Gudhi::persistence_matrix::
    Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
    ::get_column((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
                  *)local_100,2);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_140,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_150);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_140,0x341,&local_150);
      boost::test_tools::assertion_result::assertion_result(&local_168,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_188,plVar4,
                 (char (*) [51])"exception std::logic_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_168,&local_188,&ex,0x341,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_188);
      boost::test_tools::assertion_result::~assertion_result(&local_168);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_228);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,local_218,0x342,&local_228);
    Gudhi::persistence_matrix::
    Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
    ::get_column((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
                  *)local_100,4);
    do {
      uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_248);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_238,0x342,&local_248);
      boost::test_tools::assertion_result::assertion_result(&local_260,false);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_280,plVar4,
                 (char (*) [51])"exception std::logic_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_260,&local_280,&ex_1,0x342,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl(&local_280);
      boost::test_tools::assertion_result::~assertion_result(&local_260);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ppCVar1 = &m.matrix_.colSettings_;
  local_318._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)ppCVar1);
  local_310 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator+(&local_318,4);
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
            ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              *)&local_308,&local_310);
  local_320 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::erase((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)ppCVar1,local_308);
  ppCVar1 = &m.matrix_.colSettings_;
  local_338._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
       std::
       vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)ppCVar1);
  local_330 = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator+(&local_338,2);
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*>
            ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
              *)&local_328,&local_330);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::erase((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           *)ppCVar1,local_328);
  __range1._4_4_ = 0;
  ppCVar1 = &m.matrix_.colSettings_;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)ppCVar1);
  b = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)ppCVar1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&b), bVar3) {
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    if ((__range1._4_4_ == 2) || (__range1._4_4_ == 4)) {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    local_368 = witness;
    col = Gudhi::persistence_matrix::
          Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
          ::get_column((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
                        *)local_100,__range1._4_4_);
    get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>>>
              (&local_398,col);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true>>>>
              (witness,&local_398);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_398)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
  ::~Matrix((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true>_>
             *)local_100);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}